

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed,int timeProperty,HelicsError *err)

{
  element_type *peVar1;
  int iVar2;
  FedObject *pFVar3;
  int extraout_var;
  long lVar5;
  HelicsTime local_18;
  long lVar4;
  
  pFVar3 = helics::getFedObject(fed,err);
  local_18 = -1.785e+39;
  if ((pFVar3 != (FedObject *)0x0) &&
     (peVar1 = (pFVar3->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    iVar2 = (*peVar1->_vptr_Federate[7])(peVar1,timeProperty);
    lVar4 = CONCAT44(extraout_var,iVar2);
    if (lVar4 == 0x7fffffffffffffff) {
      local_18 = 9223372036.854774;
    }
    else {
      lVar5 = (lVar4 / 1000000000 + ((long)extraout_var >> 0x1f)) - ((long)extraout_var >> 0x1f);
      local_18 = (double)(lVar4 + lVar5 * -1000000000) * 1e-09 + (double)lVar5;
    }
  }
  return local_18;
}

Assistant:

HelicsTime helicsFederateGetTimeProperty(HelicsFederate fed, int timeProperty, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeprop = fedObj->getTimeProperty(timeProperty);

        return (timeprop < helics::Time::maxVal()) ? static_cast<double>(timeprop) : HELICS_TIME_MAXTIME;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}